

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

QString * funcCall(QString *__return_storage_ptr__,Command *c,int idx)

{
  char cVar1;
  bool bVar2;
  char16_t *pcVar3;
  long lVar4;
  TypedName *a;
  char *pcVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QArrayData *local_50;
  char16_t *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  if ((c->cmd).type.d.size == 4) {
    QVar6.m_data = (c->cmd).type.d.ptr;
    QVar6.m_size = 4;
    QVar7.m_data = L"void";
    QVar7.m_size = 4;
    cVar1 = QtPrivate::equalStrings(QVar6,QVar7);
    pcVar5 = "return ";
    if (cVar1 != '\0') {
      pcVar5 = "";
    }
  }
  else {
    pcVar5 = "return ";
  }
  QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)(c->cmd).name.d.ptr);
  pcVar3 = local_48;
  if (local_48 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QByteArray::_empty;
  }
  QString::asprintf((char *)__return_storage_ptr__,"%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",
                    pcVar5,pcVar3,(ulong)(uint)idx);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,1,0x10);
    }
  }
  if ((c->args).d.size != 0) {
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    lVar4 = (c->args).d.size;
    if (lVar4 != 0) {
      lVar4 = lVar4 * 0x48;
      bVar2 = true;
      do {
        if (!bVar2) {
          local_50 = (QArrayData *)0x0;
          local_48 = L", ";
          local_40 = 2;
          QString::append(__return_storage_ptr__);
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,0x10);
            }
          }
        }
        QString::append(__return_storage_ptr__);
        bVar2 = false;
        lVar4 = lVar4 + -0x48;
      } while (lVar4 != 0);
    }
    QString::append((QChar)(char16_t)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString funcCall(const VkSpecParser::Command &c, int idx)
{
    // template:
    //     [return] reinterpret_cast<PFN_vkEnumeratePhysicalDevices>(d_ptr->m_funcs[0])(instance, pPhysicalDeviceCount, pPhysicalDevices);
    QString s = QString::asprintf("%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",
                                  (c.cmd.type == QStringLiteral("void") ? "" : "return "),
                                  qPrintable(c.cmd.name),
                                  idx);
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += a.name;
        }
        s += u')';
    }
    return s;
}